

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall QRasterPaintEngine::fillRect(QRasterPaintEngine *this,QRectF *r,QColor *color)

{
  QPaintEngineState *pQVar1;
  QRasterPaintEnginePrivate *this_00;
  QClipData *pQVar2;
  QPaintEngineState *pQVar3;
  float fVar4;
  QColor QVar5;
  
  pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  this_00 = (QRasterPaintEnginePrivate *)(this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  pQVar3 = pQVar1 + -2;
  if (pQVar1 == (QPaintEngineState *)0x0) {
    pQVar3 = (QPaintEngineState *)0x0;
  }
  QVar5 = qPremultiplyWithExtraAlpha
                    (color,pQVar3[0xfe].dirtyFlags.
                           super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                           super_QFlagsStorage<QPaintEngine::DirtyFlag>.i);
  *(long *)&(this_00->solid_color_filler).solidColor = QVar5._0_8_;
  *(int *)((long)&(this_00->solid_color_filler).solidColor.ct + 4) = QVar5.ct._4_4_;
  (this_00->solid_color_filler).solidColor.ct.argb.pad = QVar5.ct._8_2_;
  fVar4 = QColor::alphaF(&(this_00->solid_color_filler).solidColor);
  if ((fVar4 <= 0.0) &&
     (pQVar3[0x6d].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
      super_QFlagsStorage<QPaintEngine::DirtyFlag>.i == 0)) {
    return;
  }
  pQVar2 = QRasterPaintEnginePrivate::clip(this_00);
  (this_00->solid_color_filler).clip = pQVar2;
  QSpanData::adjustSpanMethods(&this_00->solid_color_filler);
  fillRect(this,r,&this_00->solid_color_filler);
  return;
}

Assistant:

void QRasterPaintEngine::fillRect(const QRectF &r, const QColor &color)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::fillRect(): " << r << color;
#endif
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();

    d->solid_color_filler.solidColor = qPremultiplyWithExtraAlpha(color, s->intOpacity);

    if (d->solid_color_filler.solidColor.alphaF() <= 0.0f
        && s->composition_mode == QPainter::CompositionMode_SourceOver) {
        return;
    }
    d->solid_color_filler.clip = d->clip();
    d->solid_color_filler.adjustSpanMethods();
    fillRect(r, &d->solid_color_filler);
}